

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::DecorationManager::CloneDecorations
          (DecorationManager *this,uint32_t from,uint32_t to)

{
  undefined4 *puVar1;
  _Hash_node_base *p_Var2;
  pointer pOVar3;
  long lVar4;
  Instruction *pIVar5;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var6;
  _Hash_node_base *p_Var7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  __node_base_ptr p_Var11;
  __node_base_ptr p_Var12;
  uint uVar13;
  Operand op;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  indirect_decorations;
  undefined1 local_e8 [32];
  undefined1 local_c8 [8];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_c0;
  IRContext *local_b8;
  _Hash_node_base *local_b0;
  undefined1 local_a8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_88;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_80;
  _Hash_node_base *local_78;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  uVar8 = (this->id_to_decoration_insts_)._M_h._M_bucket_count;
  uVar9 = (ulong)from % uVar8;
  p_Var11 = (this->id_to_decoration_insts_)._M_h._M_buckets[uVar9];
  p_Var12 = (__node_base_ptr)0x0;
  if ((p_Var11 != (__node_base_ptr)0x0) &&
     (p_Var7 = p_Var11->_M_nxt, p_Var12 = p_Var11, *(uint32_t *)&p_Var11->_M_nxt[1]._M_nxt != from))
  {
    while (p_Var11 = p_Var7, p_Var7 = p_Var11->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
      p_Var12 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar8 != uVar9) ||
         (p_Var12 = p_Var11, *(uint *)&p_Var7[1]._M_nxt == from)) goto LAB_00597e1d;
    }
    p_Var12 = (__node_base_ptr)0x0;
  }
LAB_00597e1d:
  if (p_Var12 == (__node_base_ptr)0x0) {
    local_b0 = (_Hash_node_base *)0x0;
  }
  else {
    local_b0 = p_Var12->_M_nxt;
  }
  if (local_b0 != (_Hash_node_base *)0x0) {
    local_b8 = this->module_->context_;
    p_Var7 = local_b0[2]._M_nxt;
    p_Var2 = local_b0[3]._M_nxt;
    if (p_Var7 != p_Var2) {
      do {
        pIVar5 = Instruction::Clone((Instruction *)p_Var7->_M_nxt,this->module_->context_);
        local_e8._0_8_ = &PTR__SmallVector_009488e0;
        local_e8._24_8_ = (long)local_e8 + 0x10;
        local_c8 = (undefined1  [8])0x0;
        local_e8._16_4_ = to;
        local_e8._8_8_ = (_func_int **)0x1;
        uVar8 = (ulong)(pIVar5->has_result_id_ & 1) + 1;
        if (pIVar5->has_type_id_ == false) {
          uVar8 = (ulong)pIVar5->has_result_id_;
        }
        pOVar3 = (pIVar5->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar9 = ((long)(pIVar5->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
                -0x5555555555555555;
        if (uVar9 < uVar8 || uVar9 - uVar8 == 0) {
          __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2b8,
                        "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                       );
        }
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)
                   ((long)((pOVar3->words).buffer + 0xfffffffffffffffc) +
                   (ulong)(uint)((int)uVar8 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_e8);
        local_e8._0_8_ = &PTR__SmallVector_009488e0;
        if (local_c8 != (undefined1  [8])0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     local_c8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8);
        }
        utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                  (&(this->module_->annotations_).super_IntrusiveList<spvtools::opt::Instruction>,
                   pIVar5);
        IRContext::AnalyzeUses
                  (local_b8,(this->module_->annotations_).
                            super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                            super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
        p_Var7 = p_Var7 + 1;
      } while (p_Var7 != p_Var2);
    }
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              (&local_48,
               (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)(local_b0 + 5));
    local_78 = (_Hash_node_base *)
               local_48.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    p_Var7 = (_Hash_node_base *)
             local_48.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_48.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pIVar5 = (Instruction *)p_Var7->_M_nxt;
        local_b0 = p_Var7;
        if (pIVar5->opcode_ == OpGroupMemberDecorate) {
          IRContext::ForgetUses(local_b8,pIVar5);
          uVar13 = (int)((ulong)((long)*(pointer *)
                                        ((long)&(pIVar5->operands_).
                                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                ._M_impl + 8) -
                                (long)(pIVar5->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
          ;
          if (1 < uVar13) {
            uVar10 = 1;
            do {
              uVar9 = (ulong)uVar10;
              lVar4 = (long)(pIVar5->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              uVar8 = ((long)*(pointer *)
                              ((long)&(pIVar5->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl + 8) - lVar4 >> 4) * -0x5555555555555555;
              if (uVar8 < uVar9 || uVar8 - uVar9 == 0) {
LAB_0059828a:
                __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                              ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
              }
              puVar1 = (undefined4 *)(lVar4 + uVar9 * 0x30);
              local_e8._0_4_ = *puVar1;
              local_e8._8_8_ = &PTR__SmallVector_009488e0;
              local_e8._16_4_ = (array<signed_char,_4UL>)0x0;
              local_e8._20_4_ = (array<signed_char,_4UL>)0x0;
              local_c8 = (undefined1  [8])(local_e8 + 0x18);
              local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
              utils::SmallVector<unsigned_int,_2UL>::operator=
                        ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),
                         (SmallVector<unsigned_int,_2UL> *)(puVar1 + 2));
              _Var6._M_head_impl = local_c0._M_head_impl;
              if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   )local_c0._M_head_impl ==
                  (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   )0x0) {
                _Var6._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c8
                ;
              }
              if (*((_Var6._M_head_impl)->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start == from) {
                local_70._0_8_ = &PTR__SmallVector_009488e0;
                local_70._24_8_ = local_70 + 0x10;
                local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
                local_70._8_8_ = 1;
                local_a8._0_4_ = 1;
                local_a8._8_8_ = &PTR__SmallVector_009488e0;
                local_a8._16_4_ = (array<signed_char,_4UL>)0x0;
                local_a8._20_4_ = (array<signed_char,_4UL>)0x0;
                local_88._M_head_impl =
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_a8 + 0x18);
                local_80._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl =
                     (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
                local_70._16_4_ = to;
                utils::SmallVector<unsigned_int,_2UL>::operator=
                          ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8),
                           (SmallVector<unsigned_int,_2UL> *)local_70);
                std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                emplace_back<spvtools::opt::Operand>(&pIVar5->operands_,(Operand *)local_a8);
                local_a8._8_8_ = &PTR__SmallVector_009488e0;
                if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )local_80._M_t.
                      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      .
                      super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                      ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                  std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                  operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&local_80,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             local_80._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl);
                }
                local_80._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl =
                     (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
                local_70._0_8_ = &PTR__SmallVector_009488e0;
                if (local_50._M_head_impl !=
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                  std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                  operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&local_50,local_50._M_head_impl);
                }
                uVar8 = (ulong)(uVar10 + 1);
                lVar4 = (long)(pIVar5->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                uVar9 = ((long)*(pointer *)
                                ((long)&(pIVar5->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl + 8) - lVar4 >> 4) * -0x5555555555555555;
                if (uVar9 < uVar8 || uVar9 - uVar8 == 0) goto LAB_0059828a;
                puVar1 = (undefined4 *)(lVar4 + uVar8 * 0x30);
                local_e8._0_4_ = *puVar1;
                utils::SmallVector<unsigned_int,_2UL>::operator=
                          ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),
                           (SmallVector<unsigned_int,_2UL> *)(puVar1 + 2));
                std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                emplace_back<spvtools::opt::Operand>(&pIVar5->operands_,(Operand *)local_e8);
              }
              local_e8._8_8_ = &PTR__SmallVector_009488e0;
              if (local_c0._M_head_impl !=
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&local_c0,local_c0._M_head_impl);
              }
              uVar10 = uVar10 + 2;
            } while (uVar10 < uVar13);
          }
        }
        else {
          if (pIVar5->opcode_ != OpGroupDecorate) {
            __assert_fail("false && \"Unexpected decoration instruction\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                          ,0x22d,
                          "void spvtools::opt::analysis::DecorationManager::CloneDecorations(uint32_t, uint32_t)"
                         );
          }
          IRContext::ForgetUses(local_b8,pIVar5);
          local_a8._0_8_ = &PTR__SmallVector_009488e0;
          local_a8._24_8_ = (long)local_a8 + 0x10;
          local_88._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_a8._16_4_ = to;
          local_a8._8_8_ = (_func_int **)0x1;
          local_e8._0_4_ = 1;
          local_e8._8_8_ = &PTR__SmallVector_009488e0;
          local_e8._16_4_ = (array<signed_char,_4UL>)0x0;
          local_e8._20_4_ = (array<signed_char,_4UL>)0x0;
          local_c8 = (undefined1  [8])(local_e8 + 0x18);
          local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)(local_e8 + 8),
                     (SmallVector<unsigned_int,_2UL> *)local_a8);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>(&pIVar5->operands_,(Operand *)local_e8);
          local_e8._8_8_ = &PTR__SmallVector_009488e0;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_c0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
          {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_c0,local_c0._M_head_impl);
          }
          local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_a8._0_8_ = &PTR__SmallVector_009488e0;
          if (local_88._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_88,local_88._M_head_impl);
          }
        }
        IRContext::AnalyzeUses(local_b8,pIVar5);
        p_Var7 = local_b0 + 1;
      } while (local_b0 + 1 != local_78);
    }
    if ((_Hash_node_base *)
        local_48.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (_Hash_node_base *)0x0) {
      operator_delete(local_48.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void DecorationManager::CloneDecorations(uint32_t from, uint32_t to) {
  const auto decoration_list = id_to_decoration_insts_.find(from);
  if (decoration_list == id_to_decoration_insts_.end()) return;
  auto context = module_->context();
  for (Instruction* inst : decoration_list->second.direct_decorations) {
    // simply clone decoration and change |target-id| to |to|
    std::unique_ptr<Instruction> new_inst(inst->Clone(module_->context()));
    new_inst->SetInOperand(0, {to});
    module_->AddAnnotationInst(std::move(new_inst));
    auto decoration_iter = --module_->annotation_end();
    context->AnalyzeUses(&*decoration_iter);
  }
  // We need to copy the list of instructions as ForgetUses and AnalyzeUses are
  // going to modify it.
  std::vector<Instruction*> indirect_decorations =
      decoration_list->second.indirect_decorations;
  for (Instruction* inst : indirect_decorations) {
    switch (inst->opcode()) {
      case spv::Op::OpGroupDecorate:
        context->ForgetUses(inst);
        // add |to| to list of decorated id's
        inst->AddOperand(
            Operand(spv_operand_type_t::SPV_OPERAND_TYPE_ID, {to}));
        context->AnalyzeUses(inst);
        break;
      case spv::Op::OpGroupMemberDecorate: {
        context->ForgetUses(inst);
        // for each (id == from), add (to, literal) as operands
        const uint32_t num_operands = inst->NumOperands();
        for (uint32_t i = 1; i < num_operands; i += 2) {
          Operand op = inst->GetOperand(i);
          if (op.words[0] == from) {  // add new pair of operands: (to, literal)
            inst->AddOperand(
                Operand(spv_operand_type_t::SPV_OPERAND_TYPE_ID, {to}));
            op = inst->GetOperand(i + 1);
            inst->AddOperand(std::move(op));
          }
        }
        context->AnalyzeUses(inst);
        break;
      }
      default:
        assert(false && "Unexpected decoration instruction");
    }
  }
}